

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_imply_m3(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2)

{
  REF_STATUS RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  REF_DBL local_20;
  REF_DBL RStack_18;
  REF_DBL local_10;
  
  m[4] = 0.0;
  m[5] = 0.0;
  m[2] = 0.0;
  m[3] = 0.0;
  *m = 0.0;
  m[1] = 0.0;
  dVar2 = *xyz0 - *xyz1;
  dVar3 = *xyz1 - *xyz2;
  local_68 = dVar2 * dVar2;
  dStack_60 = dVar3 * dVar3;
  dVar4 = *xyz2 - *xyz0;
  local_38 = xyz0[1] - xyz1[1];
  local_58 = dVar4 * dVar4;
  dStack_50 = (dVar2 + dVar2) * local_38;
  local_48 = xyz1[1] - xyz2[1];
  local_28 = xyz2[1] - xyz0[1];
  local_38 = local_38 * local_38;
  dStack_30 = local_48 * local_48;
  local_48 = (dVar3 + dVar3) * local_48;
  dStack_40 = (dVar4 + dVar4) * local_28;
  local_28 = local_28 * local_28;
  local_20 = 1.0;
  RStack_18 = 1.0;
  local_10 = 1.0;
  RVar1 = ref_matrix_solve_ab(3,4,&local_68);
  if (RVar1 == 0) {
    *m = local_20;
    m[1] = RStack_18;
    m[2] = 0.0;
    m[3] = local_10;
    *(undefined4 *)(m + 4) = 0;
    *(undefined4 *)((long)m + 0x24) = 0;
    *(undefined4 *)(m + 5) = 0;
    *(undefined4 *)((long)m + 0x2c) = 0x3ff00000;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m3(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                       REF_DBL *xyz2) {
  REF_DBL ab[12];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab3(0, xyz0, xyz1);
  fill_ab3(1, xyz1, xyz2);
  fill_ab3(2, xyz2, xyz0);

  for (i = 0; i < 3; i++) ab[i + 3 * 3] = 1.0;

  RAISE(ref_matrix_solve_ab(3, 4, ab));

  m[0] = ab[0 + 3 * 3];
  m[1] = ab[1 + 3 * 3];
  m[2] = 0.0;
  m[3] = ab[2 + 3 * 3];
  m[4] = 0.0;
  m[5] = 1.0;

  return REF_SUCCESS;
}